

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void dlib::cpu::leaky_relu_gradient(tensor *grad,tensor *dest,tensor *gradient_input,float alpha)

{
  float fVar1;
  float fVar2;
  long lVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar11;
  long lVar10;
  
  iVar7 = (*gradient_input->_vptr_tensor[2])(gradient_input);
  iVar8 = (*dest->_vptr_tensor[2])(dest);
  iVar9 = (*grad->_vptr_tensor[3])(grad);
  lVar10 = CONCAT44(extraout_var_01,iVar9);
  lVar3 = dest->m_size;
  lVar11 = 0;
  if (grad == gradient_input) {
    for (; lVar3 != lVar11; lVar11 = lVar11 + 1) {
      fVar1 = *(float *)(CONCAT44(extraout_var,iVar7) + lVar11 * 4);
      uVar4 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                             ZEXT416(*(uint *)(CONCAT44(extraout_var_00,iVar8) + lVar11 * 4)),1);
      bVar5 = (bool)((byte)uVar4 & 1);
      *(uint *)(lVar10 + lVar11 * 4) =
           (uint)bVar5 * (int)fVar1 + (uint)!bVar5 * (int)(fVar1 * alpha);
    }
  }
  else {
    for (; lVar3 != lVar11; lVar11 = lVar11 + 1) {
      fVar1 = *(float *)(CONCAT44(extraout_var,iVar7) + lVar11 * 4);
      fVar2 = *(float *)(lVar10 + lVar11 * 4);
      uVar4 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                             ZEXT416(*(uint *)(CONCAT44(extraout_var_00,iVar8) + lVar11 * 4)),1);
      bVar5 = (bool)((byte)uVar4 & 1);
      auVar6 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)alpha),ZEXT416((uint)fVar2));
      *(uint *)(lVar10 + lVar11 * 4) =
           (uint)bVar5 * (int)(fVar1 + fVar2) + (uint)!bVar5 * auVar6._0_4_;
    }
  }
  return;
}

Assistant:

void leaky_relu_gradient (
            tensor& grad,
            const tensor& dest,
            const tensor& gradient_input,
            const float alpha
        )
        {
            const float* gi = gradient_input.host();
            const float* in = dest.host();
            float* out = grad.host();
            if (is_same_object(grad, gradient_input))
            {
                for (size_t i = 0; i < dest.size(); ++i)
                {
                    if (in[i] > 0)
                        out[i] = gi[i];
                    else
                        out[i] = alpha * gi[i];
                }
            }
            else
            {
                for (size_t i = 0; i < dest.size(); ++i)
                {
                    if (in[i] > 0)
                        out[i] += gi[i];
                    else
                        out[i] += alpha * gi[i];
                }
            }
        }